

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polyedgecurve.cpp
# Opt level: O1

bool __thiscall
ON_PolyEdgeCurve::Create(ON_PolyEdgeCurve *this,ON_BrepTrim *trim,ON_UUID *object_id)

{
  bool bVar1;
  ON_PolyEdgeSegment *this_00;
  
  ON_PolyCurve::Destroy(&this->super_ON_PolyCurve);
  if (trim == (ON_BrepTrim *)0x0) {
    bVar1 = false;
  }
  else {
    this_00 = (ON_PolyEdgeSegment *)operator_new(0x198);
    ON_PolyEdgeSegment::ON_PolyEdgeSegment(this_00);
    bVar1 = ON_PolyEdgeSegment::Create(this_00,trim,object_id);
    if (bVar1) {
      Append(this,this_00);
    }
    else {
      (*(this_00->super_ON_CurveProxy).super_ON_Curve.super_ON_Geometry.super_ON_Object.
        _vptr_ON_Object[4])(this_00);
    }
  }
  return bVar1;
}

Assistant:

bool ON_PolyEdgeCurve::Create( const ON_BrepTrim* trim, const ON_UUID& object_id )
{
  bool rc = false;
  Destroy();
  //m_is_closed_helper = 0;
  if ( trim )
  {
    ON_PolyEdgeSegment* segment = new ON_PolyEdgeSegment();
    rc = segment->Create(trim,object_id);
    if (rc )
      Append(segment);
    else
      delete segment;
  }
  return rc;
}